

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O3

void __thiscall
PoolResource<48UL,_8UL>::PoolResource(PoolResource<48UL,_8UL> *this,size_t chunk_size_bytes)

{
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = chunk_size_bytes + (ulong)(chunk_size_bytes == 0) * 8 + 7;
  this->m_chunk_size_bytes = uVar2 & 0xfffffffffffffff8;
  (this->m_allocated_chunks).super__List_base<std::byte_*,_std::allocator<std::byte_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_allocated_chunks;
  (this->m_allocated_chunks).super__List_base<std::byte_*,_std::allocator<std::byte_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_allocated_chunks;
  (this->m_allocated_chunks).super__List_base<std::byte_*,_std::allocator<std::byte_*>_>._M_impl.
  _M_node._M_size = 0;
  (this->m_free_lists)._M_elems[0] = (ListNode *)0x0;
  (this->m_free_lists)._M_elems[1] = (ListNode *)0x0;
  (this->m_free_lists)._M_elems[2] = (ListNode *)0x0;
  (this->m_free_lists)._M_elems[3] = (ListNode *)0x0;
  (this->m_free_lists)._M_elems[4] = (ListNode *)0x0;
  (this->m_free_lists)._M_elems[5] = (ListNode *)0x0;
  (this->m_free_lists)._M_elems[6] = (ListNode *)0x0;
  this->m_available_memory_it = (byte *)0x0;
  this->m_available_memory_end = (byte *)0x0;
  if (uVar2 < 0x30) {
    __assert_fail("m_chunk_size_bytes >= MAX_BLOCK_SIZE_BYTES",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/support/allocators/pool.h"
                  ,0xb4,
                  "PoolResource<48, 8>::PoolResource(std::size_t) [MAX_BLOCK_SIZE_BYTES = 48, ALIGN_BYTES = 8]"
                 );
  }
  AllocateChunk(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] static constexpr std::size_t NumElemAlignBytes(std::size_t bytes)
    {
        return (bytes + ELEM_ALIGN_BYTES - 1) / ELEM_ALIGN_BYTES + (bytes == 0);
    }